

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeDSK.cpp
# Opt level: O0

int __thiscall FormatTypeDSK::FillTrack(FormatTypeDSK *this,uchar *track_buffer,int side,int track)

{
  ushort uVar1;
  unsigned_short uVar2;
  uint uVar3;
  int iVar4;
  uchar local_7a;
  uchar uStack_79;
  uint local_78;
  unsigned_short computed_crc;
  uint k;
  uint size_of_track;
  unsigned_short computed_crc_1;
  undefined1 local_60 [8];
  CRC crc;
  uint s;
  uint last_valid_data;
  int load_disk_index;
  int N;
  int j;
  int track_local;
  int side_local;
  uchar *track_buffer_local;
  FormatTypeDSK *this_local;
  
  s = 0;
  for (load_disk_index = 0; load_disk_index < 0x50; load_disk_index = load_disk_index + 1) {
    s = IDisk::AddByteToTrack(track_buffer,s,'N',8,'\0');
  }
  for (load_disk_index = 0; load_disk_index < 0xc; load_disk_index = load_disk_index + 1) {
    s = IDisk::AddByteToTrack(track_buffer,s,'\0',8,'\0');
  }
  uVar3 = IDisk::AddSyncByteToTrack(track_buffer,s,0xc2);
  uVar3 = IDisk::AddSyncByteToTrack(track_buffer,uVar3,0xc2);
  uVar3 = IDisk::AddSyncByteToTrack(track_buffer,uVar3,0xc2);
  s = IDisk::AddByteToTrack(track_buffer,uVar3,0xfc,8,'\0');
  for (load_disk_index = 0; load_disk_index < 0x32; load_disk_index = load_disk_index + 1) {
    s = IDisk::AddByteToTrack(track_buffer,s,'N',8,'\0');
  }
  for (crc.crc_stack_.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      crc.crc_stack_.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < this->side_[side].tracks[track].nb_sector;
      crc.crc_stack_.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           crc.crc_stack_.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    CRC::CRC((CRC *)local_60);
    CRC::Reset((CRC *)local_60);
    for (load_disk_index = 0; load_disk_index < 0xc; load_disk_index = load_disk_index + 1) {
      s = IDisk::AddByteWithCrc(track_buffer,s,'\0',(CRC *)local_60,false);
    }
    CRC::Reset((CRC *)local_60);
    iVar4 = IDisk::AddByteWithCrc(track_buffer,s,0xa1,(CRC *)local_60,true);
    iVar4 = IDisk::AddByteWithCrc(track_buffer,iVar4,0xa1,(CRC *)local_60,true);
    iVar4 = IDisk::AddByteWithCrc(track_buffer,iVar4,0xa1,(CRC *)local_60,true);
    iVar4 = IDisk::AddByteWithCrc(track_buffer,iVar4,0xfe,(CRC *)local_60,false);
    iVar4 = IDisk::AddByteWithCrc
                      (track_buffer,iVar4,
                       this->side_[side].tracks[track].sectors
                       [crc.crc_stack_.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_].track,(CRC *)local_60,false
                      );
    iVar4 = IDisk::AddByteWithCrc
                      (track_buffer,iVar4,
                       this->side_[side].tracks[track].sectors
                       [crc.crc_stack_.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_].side,(CRC *)local_60,false)
    ;
    iVar4 = IDisk::AddByteWithCrc
                      (track_buffer,iVar4,
                       this->side_[side].tracks[track].sectors
                       [crc.crc_stack_.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_].sector_id,(CRC *)local_60,
                       false);
    iVar4 = IDisk::AddByteWithCrc
                      (track_buffer,iVar4,
                       this->side_[side].tracks[track].sectors
                       [crc.crc_stack_.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_].sector_size,(CRC *)local_60
                       ,false);
    uVar2 = CRC::GetCRC((CRC *)local_60);
    k._3_1_ = (uchar)(uVar2 >> 8);
    iVar4 = IDisk::AddByteWithCrc(track_buffer,iVar4,k._3_1_,(CRC *)local_60,false);
    k._2_1_ = (uchar)uVar2;
    s = IDisk::AddByteWithCrc(track_buffer,iVar4,k._2_1_,(CRC *)local_60,false);
    CRC::Reset((CRC *)local_60);
    for (load_disk_index = 0; load_disk_index < 0x16; load_disk_index = load_disk_index + 1) {
      s = IDisk::AddByteWithCrc(track_buffer,s,'N',(CRC *)local_60,false);
    }
    for (load_disk_index = 0; load_disk_index < 0xc; load_disk_index = load_disk_index + 1) {
      s = IDisk::AddByteWithCrc(track_buffer,s,'\0',(CRC *)local_60,false);
    }
    CRC::Reset((CRC *)local_60);
    iVar4 = IDisk::AddByteWithCrc(track_buffer,s,0xa1,(CRC *)local_60,true);
    iVar4 = IDisk::AddByteWithCrc(track_buffer,iVar4,0xa1,(CRC *)local_60,true);
    iVar4 = IDisk::AddByteWithCrc(track_buffer,iVar4,0xa1,(CRC *)local_60,true);
    if ((this->side_[side].tracks[track].sectors
         [crc.crc_stack_.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage._4_4_].fdc_status_2 & 0x40) == 0x40) {
      s = IDisk::AddByteWithCrc(track_buffer,iVar4,0xf8,(CRC *)local_60,false);
    }
    else {
      s = IDisk::AddByteWithCrc(track_buffer,iVar4,0xfb,(CRC *)local_60,false);
    }
    uVar1 = this->side_[side].tracks[track].sectors
            [crc.crc_stack_.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_].actual_size;
    for (local_78 = 0; local_78 < uVar1; local_78 = local_78 + 1) {
      s = IDisk::AddByteWithCrc
                    (track_buffer,s,
                     this->side_[side].tracks[track].sectors
                     [crc.crc_stack_.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_].data[local_78],
                     (CRC *)local_60,false);
    }
    uVar2 = CRC::GetCRC((CRC *)local_60);
    uStack_79 = (uchar)(uVar2 >> 8);
    iVar4 = IDisk::AddByteWithoutCrc(track_buffer,s,uStack_79,false);
    local_7a = (uchar)uVar2;
    s = IDisk::AddByteWithoutCrc(track_buffer,iVar4,local_7a,false);
    CRC::Reset((CRC *)local_60);
    for (load_disk_index = 0; load_disk_index < (int)(uint)this->side_[side].tracks[track].gap3;
        load_disk_index = load_disk_index + 1) {
      s = IDisk::AddByteWithoutCrc(track_buffer,s,this->side_[side].tracks[track].gap3_filter,false)
      ;
    }
    CRC::~CRC((CRC *)local_60);
  }
  while ((int)s < 0x4000) {
    iVar4 = IDisk::AddByteWithoutCrc(track_buffer,s,'N',false);
    s = iVar4 + 1;
  }
  return s;
}

Assistant:

int FormatTypeDSK::FillTrack(unsigned char* track_buffer, int side, int track)
{
   int j, N;

   int load_disk_index = 0;

   // GAP 4a : 80 byte with value 0x4E
   for (j = 0; j < 80; j++) load_disk_index = IDisk::AddByteToTrack(track_buffer, load_disk_index, 0x4E);

   // Sync : 12 byte with value 0x00
   for (j = 0; j < 12; j++) load_disk_index = IDisk::AddByteToTrack(track_buffer, load_disk_index, 0x00);

   // IAM : 3 byte with 0xC2, then one byte with 0xFC
   load_disk_index = IDisk::AddSyncByteToTrack(track_buffer, load_disk_index, 0xC2);
   load_disk_index = IDisk::AddSyncByteToTrack(track_buffer, load_disk_index, 0xC2);
   load_disk_index = IDisk::AddSyncByteToTrack(track_buffer, load_disk_index, 0xC2);
   load_disk_index = IDisk::AddByteToTrack(track_buffer, load_disk_index, 0xFC);

   // GAP 1 : 50 byte with 0x4E value
   for (j = 0; j < 50; j++) load_disk_index = IDisk::AddByteToTrack(track_buffer, load_disk_index, 0x4E);

   unsigned int last_valid_data = 0;

   // Then, each sectors :
   for (unsigned int s = 0; s < side_[side].tracks[track].nb_sector; s++)
   {
      CRC crc;
      // - Sync : 12 byte, value #00
      crc.Reset();
      for (j = 0; j < 12; j++) load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0x00, crc, false);

      crc.Reset();
      // - IDAM : 3 byte #A1 + 1 byte #FE
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xA1, crc, true);
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xA1, crc, true);
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xA1, crc, true);
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xFE, crc);

      // Index
      // - C (identification secteur 'C' = 1 byte)
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, side_[side].tracks[track].sectors[s].track,
                                            crc);
      // - H (identification secteur 'H' = 1 byte)
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, side_[side].tracks[track].sectors[s].side,
                                            crc);
      // - R (identification secteur 'R' = 1 byte)
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, side_[side].tracks[track].sectors[s].sector_id,
                                            crc);
      // - N (identification secteur 'N' = 1 byte)
      N = side_[side].tracks[track].sectors[s].sector_size;
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, N, crc);

      // - Crc (2 bytes) - TODO ???
      //if (NsizeOfTrack_L == sizeOfTrack_L)
      //   if (false)
      {
         unsigned short computed_crc = crc.GetCRC();
         load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, (computed_crc >> 8), crc);
         load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, (computed_crc & 0xFF), crc);
      }

      crc.Reset();

      // - GAP 2 (22 bytes #4E)
      for (j = 0; j < 22; j++) load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0x4E, crc);

      // - Sync : 12 bytes #00
      for (j = 0; j < 12; j++) load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0x00, crc);

      crc.Reset();
      // - DATA AM : 3 bytes #A1 + 1 bytes #FB ou #F8
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xA1, crc, true);
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xA1, crc, true);
      load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, 0xA1, crc, true);

      if ((side_[side].tracks[track].sectors[s].fdc_status_2 & 0x40) == 0x40)
         load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, DAAM_ERASED, crc);
      else
         load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index, DAAM_OFF, crc);

      // - n datas of sector (512 by default)
      unsigned int size_of_track = side_[side].tracks[track].sectors[s].actual_size;

      // With extension, CRC and GAP#3 are in the floppy
      for (unsigned int k = 0; k < size_of_track; k++)
      {
         load_disk_index = IDisk::AddByteWithCrc(track_buffer, load_disk_index,
                                               side_[side].tracks[track].sectors[s].data[k], crc);
      }

      // - Crc (2 bytes) - If needed....
      unsigned short computed_crc = crc.GetCRC();
      load_disk_index = IDisk::AddByteWithoutCrc(track_buffer, load_disk_index, (computed_crc >> 8));
      load_disk_index = IDisk::AddByteWithoutCrc(track_buffer, load_disk_index, (computed_crc & 0xFF));

      crc.Reset();

      // - GAP #3 (x bytes)
      for (j = 0; j < side_[side].tracks[track].gap3; j++)
      {
         load_disk_index = IDisk::AddByteWithoutCrc(track_buffer, load_disk_index, side_[side].tracks[track].gap3_filter);
      }
   }

   // End of track : GAP 4B until DEFAULT_TRACK_SIZE bytes.
   for (; load_disk_index < DEFAULT_TRACK_SIZE; load_disk_index++)
   {
      load_disk_index = IDisk::AddByteWithoutCrc(track_buffer, load_disk_index, 0x4E);
   }

   return load_disk_index;
}